

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::xml_node::print
          (xml_node *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding,
          uint depth)

{
  undefined1 local_2848 [8];
  xml_buffered_writer buffered_writer;
  uint depth_local;
  xml_encoding encoding_local;
  uint flags_local;
  char_t *indent_local;
  xml_writer *writer_local;
  xml_node *this_local;
  
  if (this->_root != (xml_node_struct *)0x0) {
    buffered_writer._10260_4_ = depth;
    impl::anon_unknown_0::xml_buffered_writer::xml_buffered_writer
              ((xml_buffered_writer *)local_2848,writer,encoding);
    impl::anon_unknown_0::node_output
              ((xml_buffered_writer *)local_2848,this->_root,indent,flags,buffered_writer._10260_4_)
    ;
    impl::anon_unknown_0::xml_buffered_writer::flush((xml_buffered_writer *)local_2848);
  }
  return;
}

Assistant:

PUGI__FN void xml_node::print(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding, unsigned int depth) const
	{
		if (!_root) return;

		impl::xml_buffered_writer buffered_writer(writer, encoding);

		impl::node_output(buffered_writer, _root, indent, flags, depth);

		buffered_writer.flush();
	}